

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O0

void pub_read_record(ENF_Data *newdata,char *buf)

{
  uint uVar1;
  Type TVar2;
  char *buf_local;
  ENF_Data *newdata_local;
  
  uVar1 = PacketProcessor::Number(*buf,buf[1],0xfe,0xfe);
  newdata->graphic = uVar1;
  uVar1 = PacketProcessor::Number(buf[3],buf[4],0xfe,0xfe);
  newdata->boss = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[5],buf[6],0xfe,0xfe);
  newdata->child = (short)uVar1;
  TVar2 = PacketProcessor::Number(buf[7],buf[8],0xfe,0xfe);
  newdata->type = TVar2;
  uVar1 = PacketProcessor::Number(buf[9],buf[10],0xfe,0xfe);
  newdata->vendor_id = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[0xb],buf[0xc],buf[0xd],0xfe);
  newdata->hp = uVar1;
  uVar1 = PacketProcessor::Number(buf[0x10],buf[0x11],0xfe,0xfe);
  newdata->mindam = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[0x12],buf[0x13],0xfe,0xfe);
  newdata->maxdam = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[0x14],buf[0x15],0xfe,0xfe);
  newdata->accuracy = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[0x16],buf[0x17],0xfe,0xfe);
  newdata->evade = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[0x18],buf[0x19],0xfe,0xfe);
  newdata->armor = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[0x24],buf[0x25],0xfe,0xfe);
  newdata->exp = (unsigned_short)uVar1;
  return;
}

Assistant:

void pub_read_record(ENF_Data& newdata, char* buf)
{
	newdata.graphic = PacketProcessor::Number(buf[0], buf[1]);

	newdata.boss = PacketProcessor::Number(buf[3], buf[4]);
	newdata.child = PacketProcessor::Number(buf[5], buf[6]);
	newdata.type = static_cast<ENF::Type>(PacketProcessor::Number(buf[7], buf[8]));
	newdata.vendor_id = PacketProcessor::Number(buf[9], buf[10]);
	newdata.hp = PacketProcessor::Number(buf[11], buf[12], buf[13]);

	newdata.mindam = PacketProcessor::Number(buf[16], buf[17]);
	newdata.maxdam = PacketProcessor::Number(buf[18], buf[19]);

	newdata.accuracy = PacketProcessor::Number(buf[20], buf[21]);
	newdata.evade = PacketProcessor::Number(buf[22], buf[23]);
	newdata.armor = PacketProcessor::Number(buf[24], buf[25]);

	newdata.exp = PacketProcessor::Number(buf[36], buf[37]);
}